

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

asn_enc_rval_t *
INTEGER_encode_xer(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
                  asn_app_consume_bytes_f *cb,void *app_key)

{
  ssize_t sVar1;
  INTEGER_t *in_RDX;
  asn_TYPE_descriptor_t *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_app_consume_bytes_f *in_R9;
  void *in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  asn_enc_rval_t er;
  INTEGER_t *st;
  char *local_60;
  char *local_58;
  
  if ((in_RDX == (INTEGER_t *)0x0) || (in_RDX->buf == (uint8_t *)0x0)) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RDX;
    if (in_RSI == (asn_TYPE_descriptor_t *)0x0) {
      local_58 = "";
    }
    else {
      local_58 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_58);
  }
  else {
    sVar1 = INTEGER__dump(in_RSI,in_RDX,in_R9,in_stack_00000008,1);
    if (sVar1 < 0) {
      in_RDI->encoded = -1;
      in_RDI->failed_type = in_RSI;
      in_RDI->structure_ptr = in_RDX;
      if (in_RSI == (asn_TYPE_descriptor_t *)0x0) {
        local_60 = "";
      }
      else {
        local_60 = in_RSI->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_60);
    }
    else {
      in_RDI->encoded = sVar1;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const INTEGER_t *st = (const INTEGER_t *)sptr;
	asn_enc_rval_t er;

	(void)ilevel;
	(void)flags;
	
	if(!st || !st->buf)
		ASN__ENCODE_FAILED;

	er.encoded = INTEGER__dump(td, st, cb, app_key, 1);
	if(er.encoded < 0) ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}